

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::Sequence::Dump(Sequence *this,FILE *stream)

{
  char identbuf [128];
  FILE *stream_local;
  Sequence *this_local;
  
  identbuf._120_8_ = stream;
  if (stream == (FILE *)0x0) {
    identbuf._120_8_ = _stderr;
  }
  StructuralComponent::Dump(&this->super_StructuralComponent,(FILE *)identbuf._120_8_);
  fprintf((FILE *)identbuf._120_8_,"  %22s:\n","StructuralComponents");
  FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>::Dump
            (&(this->StructuralComponents).
              super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>,
             (FILE *)identbuf._120_8_,0);
  return;
}

Assistant:

void
Sequence::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  StructuralComponent::Dump(stream);
  fprintf(stream, "  %22s:\n",  "StructuralComponents");
  StructuralComponents.Dump(stream);
}